

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kqueue.c
# Opt level: O2

uint get_fd_used(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  uint __fd;
  
  uVar2 = get_fd_limit();
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  uVar5 = 0;
  for (__fd = 0; uVar2 != __fd; __fd = __fd + 1) {
    iVar3 = fcntl(__fd,1);
    uVar5 = uVar5 + (iVar3 == 0);
  }
  *piVar4 = iVar1;
  return uVar5;
}

Assistant:

unsigned int
get_fd_used(void)
{
    unsigned int fd_max = get_fd_limit();
    unsigned int i;
    unsigned int used = 0;
    int our_errno = errno; /* Preserve errno */

#ifdef __linux__
    for (i = 0; i < fd_max; i++) {
        if (fcntl(i, F_GETFD) == 0)
            used++;
    }
#endif

    errno = our_errno;

    return used;
}